

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cba.h
# Opt level: O2

int Cba_ObjFinFon(Cba_Ntk_t *p,int i,int k)

{
  int iVar1;
  
  if (0 < i) {
    iVar1 = Cba_ObjFin0(p,i);
    iVar1 = Cba_FinFon(p,k + iVar1);
    return iVar1;
  }
  __assert_fail("i>0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/cba/cba.h"
                ,0xfe,"int Cba_ObjFinFon(Cba_Ntk_t *, int, int)");
}

Assistant:

static inline int            Cba_ObjFinFon( Cba_Ntk_t * p, int i, int k )    { assert(i>0); return Cba_FinFon(p, Cba_ObjFin(p, i, k));                                     }